

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon_net_linux.cpp
# Opt level: O1

int __thiscall DymonNet::connect(DymonNet *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  char *__cp;
  cJSON_bool cVar1;
  uint __fd_00;
  uint uVar2;
  cJSON *item;
  undefined4 in_register_00000034;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  timeval connectTimeout;
  timeval recvTimeout;
  timeval sendTimeout;
  sockaddr_in address;
  fd_set writeSet;
  timeval local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  sockaddr local_b8;
  fd_set local_a8;
  
  if ((cJSON *)CONCAT44(in_register_00000034,__fd) != (cJSON *)0x0) {
    item = cJSON_GetObjectItemCaseSensitive((cJSON *)CONCAT44(in_register_00000034,__fd),"ip");
    cVar1 = cJSON_IsString(item);
    if (cVar1 != 0) {
      __cp = item->valuestring;
      __fd_00 = socket(2,1,6);
      if (-1 < (int)__fd_00) {
        uVar2 = fcntl(__fd_00,3,0);
        fcntl(__fd_00,4,(ulong)(uVar2 | 0x800));
        local_b8.sa_data._2_4_ = inet_addr(__cp);
        local_b8.sa_family = 2;
        local_b8.sa_data[0] = '#';
        local_b8.sa_data[1] = -0x74;
        ::connect(__fd_00,&local_b8,0x10);
        fcntl(__fd_00,4,(ulong)uVar2);
        uStack_c0 = 0;
        uStack_d0 = 0;
        local_c8 = 5;
        local_d8 = 5;
        setsockopt(__fd_00,1,0x15,&local_c8,0x10);
        setsockopt(__fd_00,1,0x14,&local_d8,0x10);
        local_a8.fds_bits[0xe] = 0;
        local_a8.fds_bits[0xf] = 0;
        local_a8.fds_bits[0xc] = 0;
        local_a8.fds_bits[0xd] = 0;
        local_a8.fds_bits[10] = 0;
        local_a8.fds_bits[0xb] = 0;
        local_a8.fds_bits[8] = 0;
        local_a8.fds_bits[9] = 0;
        local_a8.fds_bits[6] = 0;
        local_a8.fds_bits[7] = 0;
        local_a8.fds_bits[4] = 0;
        local_a8.fds_bits[5] = 0;
        local_a8.fds_bits[2] = 0;
        local_a8.fds_bits[3] = 0;
        local_a8.fds_bits[0] = 0;
        local_a8.fds_bits[1] = 0;
        uVar4 = 1L << ((byte)__fd_00 & 0x3f);
        local_a8.fds_bits[__fd_00 >> 6] = local_a8.fds_bits[__fd_00 >> 6] | uVar4;
        local_e8.tv_usec = 0;
        local_e8.tv_sec = 5;
        select(__fd_00 + 1,(fd_set *)0x0,&local_a8,(fd_set *)0x0,&local_e8);
        bVar5 = (local_a8.fds_bits[__fd_00 >> 6] & uVar4) != 0;
        iVar3 = (int)CONCAT71((int7)(uVar4 >> 8),bVar5);
        if (bVar5) {
          *(uint *)&(this->super_Dymon).field_0x34 = __fd_00;
          return iVar3;
        }
        ::close(__fd_00);
        return iVar3;
      }
    }
  }
  return 0;
}

Assistant:

bool DymonNet::connect(void * arg)
{
   if (arg == nullptr)
   {
      return false;
   }
   cJSON * ip = cJSON_GetObjectItemCaseSensitive((cJSON *)arg, "ip"); //get IP
   if (!cJSON_IsString(ip))
   {
      return false;
   }
   const char * printerIp = ip->valuestring;
   constexpr uint16_t port = 9100;

   //try to create socket
   int sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
   if (sock < 0)
   {
      return false;
   }

   //on success
   //set the socket to non-blocking
   int flags = fcntl(sock, F_GETFL, 0);
   fcntl(sock, F_SETFL, flags | O_NONBLOCK);

   //start connecting to host
   struct sockaddr_in address;  /* the libc network address data structure */
   uint32_t addr = inet_addr(printerIp); //convert string representation of IP address (decimals and dots) to binary
   address.sin_addr.s_addr = addr; /* assign the address */
   address.sin_port = htons(port);            /* translate int2port num */
   address.sin_family = AF_INET;
   ::connect(sock, (struct sockaddr *)&address, sizeof(address));

   //go back to blocking mode
   fcntl(sock, F_SETFL, flags);
   //configure send and receive timeouts
   struct timeval sendTimeout = { 0 };
   struct timeval recvTimeout = { 0 };
   sendTimeout.tv_sec = _SEND_RECV_TIMEOUT_1S;
   recvTimeout.tv_sec = _SEND_RECV_TIMEOUT_1S;
   setsockopt(sock, SOL_SOCKET, SO_SNDTIMEO, (char *)&sendTimeout, sizeof(struct timeval));
   setsockopt(sock, SOL_SOCKET, SO_RCVTIMEO, (char *)&recvTimeout, sizeof(struct timeval));

   //wait for connection, with timeout of 2 seconds
   struct timeval connectTimeout = { 0 };
   connectTimeout.tv_sec = _CONNECT_TIMEOUT_1SEC;
   fd_set writeSet;
   FD_ZERO(&writeSet);
   FD_SET(sock, &writeSet);

   // check if the socket is ready
   select(sock + 1, nullptr, &writeSet, nullptr, &connectTimeout);
   if (FD_ISSET(sock, &writeSet))
   {
      this->sockfd = (int)sock;
      return true;
   }

   //close socket in case of timeout
   ::close(sock);
   return false;

}